

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# box_renderer.cpp
# Opt level: O3

string * __thiscall
duckdb::BoxRenderer::TryFormatLargeNumber
          (string *__return_storage_ptr__,BoxRenderer *this,string *numeric)

{
  char cVar1;
  char *pcVar2;
  ulong uVar3;
  char *__s;
  bool bVar4;
  undefined1 auVar5 [16];
  char cVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  char cVar10;
  string unit;
  string decimal_str;
  undefined1 *local_98 [2];
  undefined1 local_88 [16];
  undefined1 *local_78;
  char *local_70;
  undefined1 local_68 [16];
  BoxRenderer *local_58;
  char *local_50;
  uint local_48;
  char local_40 [16];
  
  if (numeric->_M_string_length < 6) {
LAB_00e4a4f9:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    pcVar2 = (numeric->_M_dataplus)._M_p;
    cVar1 = *pcVar2;
    uVar8 = (ulong)(cVar1 == '-');
    uVar7 = 0;
    do {
      cVar10 = pcVar2[uVar8];
      if (cVar10 == '.') break;
      if (((byte)(cVar10 - 0x3aU) < 0xf6) || (999999999999999999 < uVar7)) goto LAB_00e4a4f9;
      uVar7 = (ulong)(byte)(cVar10 - 0x30) + uVar7 * 10;
      uVar8 = uVar8 + 1;
    } while (numeric->_M_string_length != uVar8);
    local_78 = local_68;
    local_70 = (char *)0x0;
    local_68[0] = 0;
    lVar9 = 8;
    uVar8 = 0;
    local_58 = this;
    do {
      pcVar2 = local_70;
      uVar3 = *(ulong *)((long)&PTR___cxa_pure_virtual_02437998 + lVar9);
      if (uVar3 <= uVar3 / 200 + uVar7) {
        __s = *(char **)((long)&DAT_024379a0 + lVar9);
        strlen(__s);
        ::std::__cxx11::string::_M_replace((ulong)&local_78,0,pcVar2,(ulong)__s);
        uVar8 = uVar3;
      }
      lVar9 = lVar9 + 0x10;
    } while (lVar9 != 0x58);
    if (local_70 == (char *)0x0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    }
    else {
      auVar5._8_8_ = 0;
      auVar5._0_8_ = uVar7 + uVar8 / 200;
      uVar7 = SUB168(auVar5 / (ZEXT816(0) * ZEXT816(0x28f5c28f5c28f5c3) >> 0x42 &
                              (undefined1  [16])0x3fffffffffffffff),0);
      cVar10 = '\x01';
      if (9 < uVar7) {
        uVar8 = uVar7;
        cVar6 = '\x04';
        do {
          cVar10 = cVar6;
          if (uVar8 < 100) {
            cVar10 = cVar10 + -2;
            goto LAB_00e4a6b3;
          }
          if (uVar8 < 1000) {
            cVar10 = cVar10 + -1;
            goto LAB_00e4a6b3;
          }
          if (uVar8 < 10000) goto LAB_00e4a6b3;
          bVar4 = 99999 < uVar8;
          uVar8 = uVar8 / 10000;
          cVar6 = cVar10 + '\x04';
        } while (bVar4);
        cVar10 = cVar10 + '\x01';
      }
LAB_00e4a6b3:
      local_50 = local_40;
      ::std::__cxx11::string::_M_construct((ulong)&local_50,cVar10);
      ::std::__detail::__to_chars_10_impl<unsigned_long>(local_50,local_48,uVar7);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      if (cVar1 == '-') {
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      ::std::__cxx11::string::substr((ulong)local_98,(ulong)&local_50);
      ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_98[0]);
      if (local_98[0] != local_88) {
        operator_delete(local_98[0]);
      }
      ::std::__cxx11::string::push_back((char)__return_storage_ptr__);
      ::std::__cxx11::string::substr((ulong)local_98,(ulong)&local_50);
      ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_98[0]);
      if (local_98[0] != local_88) {
        operator_delete(local_98[0]);
      }
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_78);
      if (local_50 != local_40) {
        operator_delete(local_50);
      }
    }
    if (local_78 != local_68) {
      operator_delete(local_78);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string BoxRenderer::TryFormatLargeNumber(const string &numeric) {
	// we only return a readable rendering if the number is > 1 million
	if (numeric.size() <= 5) {
		// number too small for sure
		return string();
	}
	// get the number to summarize
	idx_t number = 0;
	bool negative = false;
	idx_t i = 0;
	if (numeric[0] == '-') {
		negative = true;
		i++;
	}
	for (; i < numeric.size(); i++) {
		char c = numeric[i];
		if (c == '.') {
			break;
		}
		if (c < '0' || c > '9') {
			// not a number or something funky (e.g. 1.23e7)
			// we could theoretically summarize numbers with exponents
			return string();
		}
		if (number >= 1000000000000000000ULL) {
			// number too big
			return string();
		}
		number = number * 10 + static_cast<idx_t>(c - '0');
	}
	struct UnitBase {
		idx_t base;
		const char *name;
	};
	static constexpr idx_t BASE_COUNT = 5;
	UnitBase bases[] = {{1000000ULL, "million"},
	                    {1000000000ULL, "billion"},
	                    {1000000000000ULL, "trillion"},
	                    {1000000000000000ULL, "quadrillion"},
	                    {1000000000000000000ULL, "quintillion"}};
	idx_t base = 0;
	string unit;
	for (idx_t i = 0; i < BASE_COUNT; i++) {
		// round the number according to this base
		idx_t rounded_number = number + ((bases[i].base / 100ULL) / 2);
		if (rounded_number >= bases[i].base) {
			base = bases[i].base;
			unit = bases[i].name;
		}
	}
	if (unit.empty()) {
		return string();
	}
	number += (base / 100ULL) / 2;
	idx_t decimal_unit = number / (base / 100ULL);
	string decimal_str = to_string(decimal_unit);
	string result;
	if (negative) {
		result += "-";
	}
	result += decimal_str.substr(0, decimal_str.size() - 2);
	result += config.decimal_separator == '\0' ? '.' : config.decimal_separator;
	result += decimal_str.substr(decimal_str.size() - 2, 2);
	result += " ";
	result += unit;
	return result;
}